

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

bool slang::ast::Bitstream::
     dynamicSizesMatch<slang::ast::StreamingConcatenationExpression,slang::ast::StreamingConcatenationExpression>
               (StreamingConcatenationExpression *destination,
               StreamingConcatenationExpression *source)

{
  unsigned_long uVar1;
  ulong uVar2;
  DynamicSize sourceSize;
  DynamicSize destEmpty;
  DynamicSize destFill;
  
  dynamicBitstreamSize(&sourceSize,source,Source);
  dynamicBitstreamSize(&destEmpty,destination,DestEmpty);
  if (sourceSize.isValid != true) {
    return false;
  }
  if (destEmpty.isValid == true) {
    if (sourceSize.fixed <= destEmpty.fixed) {
      if (sourceSize.multiplier == 0) {
        return destEmpty.fixed == sourceSize.fixed;
      }
      if ((destEmpty.fixed - sourceSize.fixed) % sourceSize.multiplier == 0) {
        return true;
      }
    }
    if (destEmpty.multiplier != 0) {
      uVar2 = sourceSize.fixed - destEmpty.fixed;
      if (sourceSize.fixed < destEmpty.fixed) {
        uVar2 = -(sourceSize.fixed - destEmpty.fixed);
      }
      uVar1 = std::__detail::__gcd<unsigned_long>(sourceSize.multiplier,destEmpty.multiplier);
      if (uVar2 % uVar1 == 0) {
        return true;
      }
    }
    dynamicBitstreamSize(&destFill,destination,DestFill);
    if (destFill.isValid == true) {
      uVar2 = destFill.fixed - sourceSize.fixed;
      if (destFill.fixed < sourceSize.fixed) {
        uVar2 = -(destFill.fixed - sourceSize.fixed);
      }
      if (sourceSize.multiplier != 0 || destFill.multiplier != 0) {
        uVar1 = std::__detail::__gcd<unsigned_long>(sourceSize.multiplier,destFill.multiplier);
        uVar2 = uVar2 % uVar1;
      }
      return uVar2 == 0;
    }
  }
  return false;
}

Assistant:

bool Bitstream::dynamicSizesMatch(const T1& destination, const T2& source) {
    auto sourceSize = dynamicBitstreamSize(source, BitstreamSizeMode::Source);
    auto destEmpty = dynamicBitstreamSize(destination, BitstreamSizeMode::DestEmpty);
    if (!sourceSize || !destEmpty)
        return false;

    if (destEmpty.fixed >= sourceSize.fixed) {
        auto diff = destEmpty.fixed - sourceSize.fixed;
        if (!sourceSize.multiplier)
            return diff == 0;
        if (diff % sourceSize.multiplier == 0)
            return true;
    }

    if (destEmpty.multiplier > 0) { // only for "with" range
        auto diff = destEmpty.fixed > sourceSize.fixed ? destEmpty.fixed - sourceSize.fixed
                                                       : sourceSize.fixed - destEmpty.fixed;
        if (diff % std::gcd(sourceSize.multiplier, destEmpty.multiplier) == 0)
            return true;
    }

    auto destFill = dynamicBitstreamSize(destination, BitstreamSizeMode::DestFill);
    if (!destFill)
        return false;

    /* Follow IEEE standard to check dynamic-sized types at compile-time.
     // runtime error
     struct {bit a[$]; shortint b;} a = {{1,2,3,4}, 67};
     int b = int'(a);
     // sourceMultiplier=1 sourceFixedSize=16 destEmptyMultiplier=0 destEmptyFixedSize=32
     // destFillMultiplier=0 destFillFixedSize=32

     // compile time error
     typedef struct {byte a[$]; bit b;} dest_t;
     int a;
     dest_t b = dest_t'(a);
     // sourceMultiplier=0 sourceFixedSize=32 destEmptyMultiplier=0 destEmptyFixedSize=1
     // destFillMultiplier=8 destFillFixedSize=1
     */

    uint64_t remaining;
    if (sourceSize.fixed > destFill.fixed)
        remaining = sourceSize.fixed - destFill.fixed;
    else
        remaining = destFill.fixed - sourceSize.fixed;

    if (sourceSize.multiplier == 0 && destFill.multiplier == 0)
        return remaining == 0;

    return remaining % std::gcd(sourceSize.multiplier, destFill.multiplier) == 0;
}